

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_distances.cc
# Opt level: O2

bool S2::AlwaysUpdateMinDistance<true>(S2Point *x,S2Point *a,S2Point *b,S1ChordAngle *min_dist)

{
  bool bVar1;
  double xa2;
  double xb2;
  S1ChordAngle SVar2;
  S2LogMessage local_48;
  double local_38;
  
  bVar1 = IsUnitLength(x);
  if (bVar1) {
    bVar1 = IsUnitLength(a);
    if (bVar1) {
      bVar1 = IsUnitLength(b);
      if (bVar1) {
        local_38 = x->c_[2] - a->c_[2];
        local_48._0_8_ = x->c_[0] - a->c_[0];
        local_48.stream_ = (ostream *)(x->c_[1] - a->c_[1]);
        xa2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                        ((BasicVector<Vector3,_double,_3UL> *)&local_48);
        local_38 = x->c_[2] - b->c_[2];
        local_48._0_8_ = x->c_[0] - b->c_[0];
        local_48.stream_ = (ostream *)(x->c_[1] - b->c_[1]);
        xb2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                        ((BasicVector<Vector3,_double,_3UL> *)&local_48);
        bVar1 = AlwaysUpdateMinInteriorDistance<true>(x,a,b,xa2,xb2,min_dist);
        if (!bVar1) {
          if (xa2 <= xb2) {
            xb2 = xa2;
          }
          SVar2 = S1ChordAngle::FromLength2(xb2);
          min_dist->length2_ = (double)SVar2;
        }
        return true;
      }
    }
  }
  S2LogMessage::S2LogMessage
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
             ,0xa7,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_48.stream_,
                  "Check failed: S2::IsUnitLength(x) && S2::IsUnitLength(a) && S2::IsUnitLength(b) "
                 );
  abort();
}

Assistant:

inline bool AlwaysUpdateMinDistance(const S2Point& x,
                                    const S2Point& a, const S2Point& b,
                                    S1ChordAngle* min_dist) {
  S2_DCHECK(S2::IsUnitLength(x) && S2::IsUnitLength(a) && S2::IsUnitLength(b));

  double xa2 = (x-a).Norm2(), xb2 = (x-b).Norm2();
  if (AlwaysUpdateMinInteriorDistance<always_update>(x, a, b, xa2, xb2,
                                                     min_dist)) {
    return true;  // Minimum distance is attained along the edge interior.
  }
  // Otherwise the minimum distance is to one of the endpoints.
  double dist2 = min(xa2, xb2);
  if (!always_update && dist2 >= min_dist->length2()) {
    return false;
  }
  *min_dist = S1ChordAngle::FromLength2(dist2);
  return true;
}